

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall
obs::safe_list<obs::slot<int_()>_>::iterator::iterator
          (iterator *this,safe_list<obs::slot<int_()>_> *list,node *node)

{
  this->m_list = list;
  this->m_node = node;
  this->m_value = (slot<int_()> *)0x0;
  this->m_locked = false;
  this->m_next_iterator = (iterator *)0x0;
  ref(list);
  if (this->m_node != (node *)0x0) {
    lock(this);
    return;
  }
  return;
}

Assistant:

iterator(safe_list& list, node* node)
      : m_list(list),
        m_node(node) {
      m_list.ref();

      // Lock the node because this iterator is pointing to it.
      if (m_node)
        lock();
    }